

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

string * proto2_unittest::ForeignEnumLite_Name_abi_cxx11_(ForeignEnumLite value)

{
  int iVar1;
  string *local_30;
  int idx;
  ForeignEnumLite value_local;
  
  if (ForeignEnumLite_Name[abi:cxx11](proto2_unittest::ForeignEnumLite)::kDummy == '\0') {
    iVar1 = __cxa_guard_acquire(&ForeignEnumLite_Name[abi:cxx11](proto2_unittest::ForeignEnumLite)::
                                 kDummy);
    if (iVar1 != 0) {
      ForeignEnumLite_Name::kDummy =
           google::protobuf::internal::InitializeEnumStrings
                     ((EnumEntry *)ForeignEnumLite_entries,(int *)ForeignEnumLite_entries_by_number,
                      3,(ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
                         *)ForeignEnumLite_strings_abi_cxx11_);
      __cxa_guard_release(&ForeignEnumLite_Name[abi:cxx11](proto2_unittest::ForeignEnumLite)::kDummy
                         );
    }
  }
  iVar1 = google::protobuf::internal::LookUpEnumName
                    ((EnumEntry *)ForeignEnumLite_entries,(int *)ForeignEnumLite_entries_by_number,3
                     ,value);
  if (iVar1 == -1) {
    local_30 = google::protobuf::internal::GetEmptyString_abi_cxx11_();
  }
  else {
    local_30 = google::protobuf::internal::
               ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
               ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
                      *)(ForeignEnumLite_strings_abi_cxx11_ + (long)iVar1 * 0x20));
  }
  return local_30;
}

Assistant:

const ::std::string& ForeignEnumLite_Name(ForeignEnumLite value) {
  static const bool kDummy = ::google::protobuf::internal::InitializeEnumStrings(
      ForeignEnumLite_entries, ForeignEnumLite_entries_by_number, 3,
      ForeignEnumLite_strings);
  (void)kDummy;

  int idx = ::google::protobuf::internal::LookUpEnumName(ForeignEnumLite_entries,
                                  ForeignEnumLite_entries_by_number,
                                  3, value);
  return idx == -1 ? ::google::protobuf::internal::GetEmptyString() : ForeignEnumLite_strings[idx].get();
}